

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O2

int coda_mem_type_update(coda_dynamic_type **type,coda_type *definition)

{
  mem_type_tag mVar1;
  coda_type_record *definition_00;
  long lVar2;
  uint __line;
  int iVar3;
  coda_type *type_00;
  coda_expression *pcVar4;
  coda_mem_record *pcVar5;
  coda_type_array *pcVar6;
  char *__assertion;
  long lVar7;
  long lVar8;
  
  type_00 = (coda_type *)*type;
  do {
    if (type_00->format != coda_backend_memory) {
      if (type_00->format < 2) {
        if (type_00 == definition) {
          return 0;
        }
        __assertion = "coda_get_type_for_dynamic_type(*type) == definition";
        __line = 0x68;
      }
      else {
        __assertion = "(*type)->backend == coda_backend_memory";
        __line = 0x6c;
      }
LAB_0015ca5f:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                    ,__line,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
    }
    pcVar6 = *(coda_type_array **)&type_00->type_class;
    if (pcVar6 == (coda_type_array *)definition) {
LAB_0015c89e:
      mVar1 = *(mem_type_tag *)&type_00->name;
      if (mVar1 == tag_mem_record) {
        pcVar6 = *(coda_type_array **)&type_00->type_class;
        if (type_00->bit_size < *(long *)&pcVar6->num_dims) {
          pcVar4 = (coda_expression *)realloc(type_00->size_expr,*(long *)&pcVar6->num_dims << 3);
          if (pcVar4 == (coda_expression *)0x0) {
            coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                           *(long *)&(*(coda_type_array **)&type_00->type_class)->num_dims << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                           ,0xb5);
            return -1;
          }
          type_00->size_expr = pcVar4;
          lVar7 = (long)(int)type_00->bit_size;
          while( true ) {
            pcVar6 = *(coda_type_array **)&type_00->type_class;
            if (*(long *)&pcVar6->num_dims <= lVar7) break;
            *(undefined8 *)(&type_00->size_expr->tag + lVar7 * 2) = 0;
            lVar7 = lVar7 + 1;
          }
          type_00->bit_size = *(long *)&pcVar6->num_dims;
        }
        lVar8 = 0;
        for (lVar7 = 0; lVar7 < *(long *)&pcVar6->num_dims; lVar7 = lVar7 + 1) {
          lVar2 = *(long *)(pcVar6->dim[0] + lVar8);
          if (*(long *)((long)&type_00->size_expr->tag + lVar8) == 0) {
            if (*(char *)(lVar2 + 0x1c) == '\0') {
              *(undefined1 *)(lVar2 + 0x1c) = 1;
            }
          }
          else {
            iVar3 = coda_mem_type_update
                              ((coda_dynamic_type **)((long)&type_00->size_expr->tag + lVar8),
                               *(coda_type **)(lVar2 + 0x10));
            if (iVar3 != 0) {
              return -1;
            }
            pcVar6 = *(coda_type_array **)&type_00->type_class;
          }
          lVar8 = lVar8 + 8;
        }
      }
      else if (mVar1 == tag_mem_special) {
        iVar3 = coda_mem_type_update
                          ((coda_dynamic_type **)&type_00->bit_size,
                           (coda_type *)(*(coda_type_array **)&type_00->type_class)->num_elements);
        if (iVar3 != 0) {
          return -1;
        }
      }
      else if (mVar1 == tag_mem_array) {
        lVar7 = -1;
        lVar8 = 0;
        while (lVar7 = lVar7 + 1, lVar7 < type_00->bit_size) {
          iVar3 = coda_mem_type_update
                            ((coda_dynamic_type **)((long)&type_00->size_expr->tag + lVar8),
                             (*(coda_type_array **)&type_00->type_class)->base_type);
          lVar8 = lVar8 + 8;
          if (iVar3 != 0) {
            return -1;
          }
        }
      }
      if ((coda_dynamic_type *)type_00->description == (coda_dynamic_type *)0x0) {
        definition_00 = (*(coda_type_array **)&type_00->type_class)->attributes;
        if (definition_00 == (coda_type_record *)0x0) {
          return 0;
        }
        pcVar5 = coda_mem_record_new(definition_00,(coda_dynamic_type *)0x0);
        type_00->description = (char *)pcVar5;
        if (pcVar5 == (coda_mem_record *)0x0) {
          return -1;
        }
      }
      iVar3 = coda_mem_type_update
                        ((coda_dynamic_type **)&type_00->description,
                         (coda_type *)(*(coda_type_array **)&type_00->type_class)->attributes);
      if (iVar3 == 0) {
        return 0;
      }
      return -1;
    }
    if (definition->type_class != coda_array_class) {
      if ((definition->type_class == coda_text_class) && (pcVar6->type_class == coda_record_class))
      {
        if (pcVar6->format != coda_format_xml) {
          __assert_fail("(*type)->definition->format == coda_format_xml",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                        ,0x8d,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
        }
        if (*(long *)&pcVar6->num_dims != 0) {
          __assert_fail("((coda_type_record *)(*type)->definition)->num_fields == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                        ,0x8e,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
        }
        type_00 = (coda_type *)
                  coda_mem_string_new((coda_type_text *)definition,(coda_dynamic_type *)0x0,
                                      (coda_product *)0x0,(char *)0x0);
        if ((coda_dynamic_type *)type_00->description != (coda_dynamic_type *)0x0) {
          coda_dynamic_type_delete((coda_dynamic_type *)type_00->description);
        }
        type_00->description = (char *)(*type)[1].definition;
        (*type)[1].definition = (coda_type *)0x0;
        coda_dynamic_type_delete(*type);
        *type = (coda_dynamic_type *)type_00;
        goto LAB_0015c89e;
      }
LAB_0015ca29:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                    ,0x9d,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
    }
    if (pcVar6->type_class == coda_array_class) goto LAB_0015ca29;
    if (definition->format != coda_format_xml) {
      __assertion = "definition->format == coda_format_xml";
      __line = 0x72;
      goto LAB_0015ca5f;
    }
    type_00 = (coda_type *)
              coda_mem_array_new((coda_type_array *)definition,(coda_dynamic_type *)0x0);
    if (type_00 == (coda_type *)0x0) {
      return -1;
    }
    iVar3 = coda_mem_type_update(type,*(coda_type **)(definition + 1));
    if ((iVar3 != 0) ||
       (iVar3 = coda_mem_array_add_element((coda_mem_array *)type_00,*type), iVar3 != 0)) {
      coda_dynamic_type_delete((coda_dynamic_type *)type_00);
      return -1;
    }
    *type = (coda_dynamic_type *)type_00;
  } while( true );
}

Assistant:

int coda_mem_type_update(coda_dynamic_type **type, coda_type *definition)
{
    coda_mem_type *mem_type;
    int i;

    if ((*type)->backend == coda_backend_ascii || (*type)->backend == coda_backend_binary)
    {
        assert(coda_get_type_for_dynamic_type(*type) == definition);
        return 0;
    }

    assert((*type)->backend == coda_backend_memory);

    if ((*type)->definition != definition)
    {
        if (definition->type_class == coda_array_class && (*type)->definition->type_class != coda_array_class)
        {
            assert(definition->format == coda_format_xml);

            /* convert the single element into an array of a single element */
            mem_type = (coda_mem_type *)coda_mem_array_new((coda_type_array *)definition, NULL);
            if (mem_type == NULL)
            {
                return -1;
            }
            /* make sure that the array element is updated to allow it to be added to the array */
            if (coda_mem_type_update(type, ((coda_type_array *)definition)->base_type) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)mem_type);
                return -1;
            }
            if (coda_mem_array_add_element((coda_mem_array *)mem_type, *type) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)mem_type);
                return -1;
            }
            *type = (coda_dynamic_type *)mem_type;

            /* finally update the array itself (for e.g. attributes) */
            return coda_mem_type_update(type, definition);
        }

        if ((*type)->definition->type_class == coda_record_class && definition->type_class == coda_text_class)
        {
            assert((*type)->definition->format == coda_format_xml);
            assert(((coda_type_record *)(*type)->definition)->num_fields == 0);

            /* convert record to text */
            mem_type = (coda_mem_type *)coda_mem_string_new((coda_type_text *)definition, NULL, NULL, NULL);
            if (mem_type->attributes != NULL)
            {
                coda_dynamic_type_delete(mem_type->attributes);
            }
            mem_type->attributes = ((coda_mem_record *)*type)->attributes;
            ((coda_mem_type *)*type)->attributes = NULL;
            coda_dynamic_type_delete(*type);
            *type = (coda_dynamic_type *)mem_type;
        }
        else
        {
            assert(0);
            exit(1);
        }
    }

    mem_type = (coda_mem_type *)*type;

    switch (mem_type->tag)
    {
        case tag_mem_record:
            {
                coda_mem_record *record_type = (coda_mem_record *)mem_type;

                if (record_type->num_fields < record_type->definition->num_fields)
                {
                    coda_dynamic_type **new_field_type;

                    /* increase the size for the child elements array until it matches the size in the definition */
                    new_field_type = realloc(record_type->field_type,
                                             record_type->definition->num_fields * sizeof(coda_dynamic_type *));
                    if (new_field_type == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                                       record_type->definition->num_fields * sizeof(coda_dynamic_type *), __FILE__,
                                       __LINE__);

                        return -1;
                    }
                    record_type->field_type = new_field_type;
                    for (i = record_type->num_fields; i < record_type->definition->num_fields; i++)
                    {
                        record_type->field_type[i] = NULL;
                    }
                    record_type->num_fields = record_type->definition->num_fields;
                }
                for (i = 0; i < record_type->definition->num_fields; i++)
                {
                    if (record_type->field_type[i] == NULL)
                    {
                        if (!record_type->definition->field[i]->optional)
                        {
                            record_type->definition->field[i]->optional = 1;
                        }
                    }
                    else
                    {
                        if (coda_mem_type_update(&record_type->field_type[i],
                                                 record_type->definition->field[i]->type) != 0)
                        {
                            return -1;
                        }
                    }
                }
            }
            break;
        case tag_mem_array:
            {
                for (i = 0; i < ((coda_mem_array *)mem_type)->num_elements; i++)
                {
                    if (coda_mem_type_update(&((coda_mem_array *)mem_type)->element[i],
                                             ((coda_mem_array *)mem_type)->definition->base_type) != 0)
                    {
                        return -1;
                    }
                }
            }
            break;
        case tag_mem_data:
            break;
        case tag_mem_special:
            if (coda_mem_type_update(&((coda_mem_special *)mem_type)->base_type,
                                     ((coda_mem_special *)mem_type)->definition->base_type) != 0)
            {
                return -1;
            }
            break;
    }

    if (mem_type->attributes == NULL && mem_type->definition->attributes != NULL)
    {
        mem_type->attributes = (coda_dynamic_type *)coda_mem_record_new(mem_type->definition->attributes, NULL);
        if (mem_type->attributes == NULL)
        {
            return -1;
        }
    }
    if (mem_type->attributes != NULL)
    {
        if (coda_mem_type_update((coda_dynamic_type **)&mem_type->attributes,
                                 (coda_type *)mem_type->definition->attributes) != 0)
        {
            return -1;
        }
    }

    return 0;
}